

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TicsSpecs.hpp
# Opt level: O3

void __thiscall sciplot::TicsSpecs::repr_abi_cxx11_(TicsSpecs *this)

{
  long in_RSI;
  
  repr_abi_cxx11_((string *)this,(TicsSpecs *)(in_RSI + -0xd0));
  return;
}

Assistant:

inline auto TicsSpecs::repr() const -> std::string
{
    const auto baserepr = TicsSpecsBaseOf<TicsSpecs>::repr();

    if(isHidden())
        return baserepr;

    std::stringstream ss;
    ss << baserepr << " ";
    ss << m_depth;
    return internal::removeExtraWhitespaces(ss.str());
}